

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O1

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>
slang::ast::AttributeSymbol::fromSyntax
          (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,LookupLocation lookupLocation)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this;
  pointer ppAVar1;
  Compilation **ppCVar2;
  size_t *psVar3;
  AttributeInstanceSyntax *pAVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  uint uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  size_t sVar11;
  int iVar12;
  TypedBumpAllocator<slang::ConstantValue> *this_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  ConstantValue *args_2;
  uint64_t uVar14;
  Diagnostic *this_01;
  undefined4 extraout_var;
  uint uVar16;
  long lVar17;
  Scope *extraout_RDX;
  Scope *pSVar18;
  Scope *extraout_RDX_00;
  Scope *extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong uVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  ulong uVar21;
  pointer ppAVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  string_view sVar33;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar34;
  try_emplace_args_t local_219;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_218;
  uint local_210;
  undefined2 local_20c;
  string_view name;
  AttributeSymbol *attr;
  ulong local_1f0;
  uint64_t local_1e8;
  size_t *local_1e0;
  size_t *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  long local_1b8;
  Scope *local_1b0;
  Compilation *local_1a8;
  char *local_1a0;
  Scope *local_198;
  ConstantValue value;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  LookupLocation lookupLocation_local;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  pointer ppAVar15;
  
  ppAVar22 = syntax._M_ptr;
  lookupLocation_local.scope = lookupLocation.scope;
  lookupLocation_local.index = lookupLocation.index;
  if (syntax._M_extent._M_extent_value._M_extent_value == 0) {
    _Var20._M_extent_value = 0;
    ppAVar15 = (pointer)0x0;
  }
  else {
    nameMap.super_Storage.ptr = (char *)&nameMap;
    nameMap._112_8_ = 0x3f;
    nameMap._120_8_ = 1;
    nameMap._128_16_ = ZEXT816(0x516460);
    nameMap._144_8_ = 0;
    nameMap._152_8_ = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.cap = 5;
    local_1a8 = scope->compilation;
    ppAVar1 = ppAVar22 + syntax._M_extent._M_extent_value._M_extent_value;
    this_00 = &local_1a8->constantAllocator;
    local_198 = scope;
    nameMap.super_Storage._104_8_ = nameMap.super_Storage.ptr;
    do {
      pAVar4 = *ppAVar22;
      uVar19 = (pAVar4->specs).elements._M_extent._M_extent_value + 1;
      if (1 < uVar19) {
        uVar29 = 0;
        do {
          ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((pAVar4->specs).elements._M_ptr + uVar29 * 2));
          pSVar5 = *ppSVar13;
          this = pSVar5 + 1;
          sVar33 = parsing::Token::valueText((Token *)this);
          scope = (Scope *)sVar33._M_str;
          name = sVar33;
          if (sVar33._M_len != 0) {
            if (pSVar5[1].previewNode == (SyntaxNode *)0x0) {
              local_210 = 1;
              local_20c = 0;
              local_218.val = 1;
              SVInt::clearUnusedBits((SVInt *)&local_218);
              auVar31 = value.value.
                        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        ._M_u._M_rest._0_16_;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._0_8_ = local_218;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._12_1_ = (undefined1)local_20c;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._8_4_ = local_210;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._14_2_ = auVar31._14_2_;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._13_1_ = local_20c._1_1_;
              if (0x40 < local_210 || (local_20c & 0x100) != 0) {
                local_218.val = 0;
              }
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_index = '\x01';
              if ((0x40 < local_210 || (local_20c & 0x100) != 0) &&
                 ((void *)local_218.val != (void *)0x0)) {
                operator_delete__(local_218.pVal);
              }
              local_218 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this);
              args_2 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                 (this_00,&value);
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                               (&local_1a8->super_BumpAllocator,&name,(SourceLocation *)&local_218,
                                args_2);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&value);
            }
            else {
              local_218 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this);
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._M_rest._0_16_ = (undefined1  [16])(undefined1  [16])sVar33;
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ExpressionSyntax&>
                               (&local_1a8->super_BumpAllocator,
                                (basic_string_view<char,_std::char_traits<char>_> *)&value,
                                (SourceLocation *)&local_218,local_198,&lookupLocation_local,
                                (ExpressionSyntax *)pSVar5[1].previewNode[1].previewNode);
            }
            (attr->super_Symbol).originatingSyntax = pSVar5;
            uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&nameMap.super_Storage.field_0x68,&name);
            uVar21 = uVar14 >> (nameMap._112_1_ & 0x3f);
            lVar17 = (uVar14 & 0xff) * 4;
            cVar7 = (&UNK_0051605c)[lVar17];
            cVar8 = (&UNK_0051605d)[lVar17];
            cVar9 = (&UNK_0051605e)[lVar17];
            cVar10 = (&UNK_0051605f)[lVar17];
            sVar11 = name._M_len;
            local_1a0 = name._M_str;
            uVar14 = (uint64_t)((uint)uVar14 & 7);
            uVar24 = 0;
            lVar17 = nameMap._136_8_;
            pSVar18 = (Scope *)nameMap._128_8_;
            uVar23 = nameMap._120_8_;
            do {
              ppCVar2 = &pSVar18->compilation + uVar21 * 2;
              auVar31[0] = -(*(char *)ppCVar2 == cVar7);
              auVar31[1] = -(*(char *)((long)ppCVar2 + 1) == cVar8);
              auVar31[2] = -(*(char *)((long)ppCVar2 + 2) == cVar9);
              auVar31[3] = -(*(char *)((long)ppCVar2 + 3) == cVar10);
              auVar31[4] = -(*(char *)((long)ppCVar2 + 4) == cVar7);
              auVar31[5] = -(*(char *)((long)ppCVar2 + 5) == cVar8);
              auVar31[6] = -(*(char *)((long)ppCVar2 + 6) == cVar9);
              auVar31[7] = -(*(char *)((long)ppCVar2 + 7) == cVar10);
              auVar31[8] = -(*(char *)(ppCVar2 + 1) == cVar7);
              auVar31[9] = -(*(char *)((long)ppCVar2 + 9) == cVar8);
              auVar31[10] = -(*(char *)((long)ppCVar2 + 10) == cVar9);
              auVar31[0xb] = -(*(char *)((long)ppCVar2 + 0xb) == cVar10);
              auVar31[0xc] = -(*(char *)((long)ppCVar2 + 0xc) == cVar7);
              auVar31[0xd] = -(*(char *)((long)ppCVar2 + 0xd) == cVar8);
              auVar31[0xe] = -(*(char *)((long)ppCVar2 + 0xe) == cVar9);
              auVar31[0xf] = -(*(char *)((long)ppCVar2 + 0xf) == cVar10);
              uVar16 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
              uVar27 = uVar24;
              uVar28 = uVar21 * 0x10;
              if (uVar16 != 0) {
                lVar26 = lVar17 + uVar21 * 0x168;
                local_1f0 = uVar21;
                local_1e8 = uVar14;
                local_1d0 = uVar21 * 0x10;
                local_1c8 = uVar24;
                local_1c0 = uVar23;
                local_1b8 = lVar17;
                local_1b0 = pSVar18;
                do {
                  uVar6 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  psVar3 = (size_t *)(lVar26 + (ulong)uVar6 * 0x18);
                  bVar30 = sVar11 == *psVar3;
                  if ((sVar11 != 0) && (sVar11 == *psVar3)) {
                    iVar12 = bcmp(local_1a0,(void *)psVar3[1],sVar11);
                    bVar30 = iVar12 == 0;
                  }
                  if (bVar30) goto LAB_004cf82f;
                  uVar16 = uVar16 - 1 & uVar16;
                  lVar17 = local_1b8;
                  uVar14 = local_1e8;
                  uVar21 = local_1f0;
                  pSVar18 = local_1b0;
                  uVar23 = local_1c0;
                  uVar27 = local_1c8;
                  uVar28 = local_1d0;
                } while (uVar16 != 0);
              }
              if ((*(byte *)((long)&pSVar18->thisSym + uVar28 + 7) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar14]) == 0) break;
              uVar24 = uVar27 + 1;
              uVar21 = uVar21 + uVar27 + 1 & uVar23;
            } while (uVar24 <= uVar23);
            local_1e0 = (size_t *)0x0;
            psVar3 = local_1e0;
LAB_004cf82f:
            local_1e0 = psVar3;
            if (local_1e0 == (size_t *)0x0) {
              SmallVectorBase<slang::ast::AttributeSymbol_const*>::
              emplace_back<slang::ast::AttributeSymbol_const*const&>
                        ((SmallVectorBase<slang::ast::AttributeSymbol_const*> *)&attrs,&attr);
              local_218.pVal =
                   (uint64_t *)
                   (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len - 1);
              uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)&nameMap.super_Storage.field_0x68,&name);
              uVar24 = uVar14 >> (nameMap._112_1_ & 0x3f);
              lVar17 = (uVar14 & 0xff) * 4;
              cVar7 = (&UNK_0051605c)[lVar17];
              cVar8 = (&UNK_0051605d)[lVar17];
              cVar9 = (&UNK_0051605e)[lVar17];
              cVar10 = (&UNK_0051605f)[lVar17];
              sVar11 = name._M_len;
              local_1a0 = name._M_str;
              uVar21 = (ulong)((uint)uVar14 & 7);
              uVar28 = 0;
              lVar17 = nameMap._136_8_;
              scope = (Scope *)nameMap._128_8_;
              uVar23 = nameMap._120_8_;
              uVar27 = uVar24;
              do {
                ppCVar2 = &scope->compilation + uVar27 * 2;
                auVar32[0] = -(*(char *)ppCVar2 == cVar7);
                auVar32[1] = -(*(char *)((long)ppCVar2 + 1) == cVar8);
                auVar32[2] = -(*(char *)((long)ppCVar2 + 2) == cVar9);
                auVar32[3] = -(*(char *)((long)ppCVar2 + 3) == cVar10);
                auVar32[4] = -(*(char *)((long)ppCVar2 + 4) == cVar7);
                auVar32[5] = -(*(char *)((long)ppCVar2 + 5) == cVar8);
                auVar32[6] = -(*(char *)((long)ppCVar2 + 6) == cVar9);
                auVar32[7] = -(*(char *)((long)ppCVar2 + 7) == cVar10);
                auVar32[8] = -(*(char *)(ppCVar2 + 1) == cVar7);
                auVar32[9] = -(*(char *)((long)ppCVar2 + 9) == cVar8);
                auVar32[10] = -(*(char *)((long)ppCVar2 + 10) == cVar9);
                auVar32[0xb] = -(*(char *)((long)ppCVar2 + 0xb) == cVar10);
                auVar32[0xc] = -(*(char *)((long)ppCVar2 + 0xc) == cVar7);
                auVar32[0xd] = -(*(char *)((long)ppCVar2 + 0xd) == cVar8);
                auVar32[0xe] = -(*(char *)((long)ppCVar2 + 0xe) == cVar9);
                auVar32[0xf] = -(*(char *)((long)ppCVar2 + 0xf) == cVar10);
                uVar16 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
                pSVar18 = scope;
                uVar25 = uVar27;
                if (uVar16 != 0) {
                  lVar26 = lVar17 + uVar27 * 0x168;
                  local_1f0 = uVar24;
                  local_1e8 = uVar14;
                  local_1d0 = uVar27;
                  local_1c8 = uVar23;
                  local_1c0 = uVar21;
                  local_1b8 = lVar17;
                  local_1b0 = scope;
                  do {
                    uVar6 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                      }
                    }
                    psVar3 = (size_t *)(lVar26 + (ulong)uVar6 * 0x18);
                    bVar30 = sVar11 == *psVar3;
                    if ((sVar11 != 0) && (sVar11 == *psVar3)) {
                      iVar12 = bcmp(local_1a0,(void *)psVar3[1],sVar11);
                      bVar30 = iVar12 == 0;
                      scope = extraout_RDX;
                    }
                    uVar14 = local_1e8;
                    uVar24 = local_1f0;
                    if (bVar30) goto LAB_004cfa5e;
                    uVar16 = uVar16 - 1 & uVar16;
                    lVar17 = local_1b8;
                    pSVar18 = local_1b0;
                    uVar21 = local_1c0;
                    uVar23 = local_1c8;
                    uVar25 = local_1d0;
                  } while (uVar16 != 0);
                }
                scope = pSVar18;
                if ((*(byte *)((long)&pSVar18->thisSym + uVar27 * 0x10 + 7) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar21]) == 0) break;
                lVar26 = uVar25 + uVar28;
                uVar28 = uVar28 + 1;
                uVar27 = lVar26 + 1U & uVar23;
              } while (uVar28 <= uVar23);
              local_1d8 = (size_t *)0x0;
              psVar3 = local_1d8;
LAB_004cfa5e:
              local_1d8 = psVar3;
              if (local_1d8 == (size_t *)0x0) {
                if ((ulong)nameMap._152_8_ < (ulong)nameMap._144_8_) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                            ((locator *)&value,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                              *)&nameMap.super_Storage.field_0x68,(arrays_type *)&nameMap.field_0x70
                             ,uVar24,uVar14,&local_219,&name,&local_218.val);
                  nameMap._152_8_ = nameMap._152_8_ + 1;
                  scope = extraout_RDX_00;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                            ((locator *)&value,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                              *)&nameMap.super_Storage.field_0x68,uVar14,&local_219,&name,
                             &local_218.val);
                  scope = extraout_RDX_01;
                }
              }
            }
            else {
              this_01 = Scope::addDiag(local_198,(DiagCode)0xed0006,(attr->super_Symbol).location);
              Diagnostic::operator<<(this_01,name);
              attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_[local_1e0[2]] =
                   attr;
              scope = (Scope *)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.
                               data_;
            }
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar19 >> 1);
      }
      ppAVar22 = ppAVar22 + 1;
    } while (ppAVar22 != ppAVar1);
    iVar12 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                       (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
                        (EVP_PKEY_CTX *)local_1a8,(EVP_PKEY_CTX *)scope);
    ppAVar15 = (pointer)CONCAT44(extraout_var,iVar12);
    if (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ !=
        (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement) {
      operator_delete(attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_);
    }
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)nameMap.super_Storage._104_8_;
    _Var20._M_extent_value = extraout_RDX_02;
    if (nameMap._136_8_ != 0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
                    *)&attrs,
                   (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    *)nameMap._136_8_,(nameMap._120_8_ * 0x178 + 0x186U) / 0x18);
    }
  }
  sVar34._M_extent._M_extent_value = _Var20._M_extent_value;
  sVar34._M_ptr = ppAVar15;
  return sVar34;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    LookupLocation lookupLocation) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope,
        [&scope, &lookupLocation](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, scope, lookupLocation,
                                                          exprSyntax);
        });
}